

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O0

int __thiscall
bv::internal::bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
copy(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
    EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  EVP_PKEY_CTX *in_R8;
  size_t destlen;
  size_t srclen;
  size_t in_stack_00000038;
  size_t in_stack_00000040;
  size_t in_stack_00000048;
  size_t in_stack_00000050;
  bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
  *in_stack_00000058;
  bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
  *in_stack_00000060;
  
  if (((EVP_PKEY_CTX *)this == dst) && (src < in_R8)) {
    copy_backward<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
              (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000040,in_stack_00000038);
    iVar1 = extraout_EAX;
  }
  else {
    copy_forward<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
              (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000040,in_stack_00000038);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void bitview<Container>::copy(bitview const&src,
                                      size_t src_begin, size_t src_end,
                                      size_t dest_begin, size_t dest_end)
        {
            size_t srclen = src_end - src_begin;
            size_t destlen = dest_end - dest_begin;
            
            if(destlen < srclen) {
                src_end = src_begin + destlen;
                srclen  = destlen;
            }
            
            if(this == &src && src_begin < dest_begin)
                copy_backward(src, src_begin, src_end, 
                              dest_begin, dest_begin + srclen);
            else
                copy_forward(src, src_begin, src_end, 
                             dest_begin, dest_begin + srclen);
        }